

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O2

void __thiscall ThreadPool::Run(ThreadPool *this,CallFunc *func)

{
  size_type sVar1;
  LockGuard lock;
  LockGuard LStack_28;
  
  if (this->m_bRunning != false) {
    LockGuard::LockGuard(&LStack_28,&this->m_mutex);
    while( true ) {
      sVar1 = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::size
                        (&this->m_tasks);
      if (sVar1 < (ulong)(long)this->m_maxTaskNum) break;
      Condition::Wait(&this->m_notFull);
    }
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
              (&this->m_tasks,func);
    Condition::Notify(&this->m_notEmpty);
    LockGuard::~LockGuard(&LStack_28);
    return;
  }
  std::function<void_()>::operator()(func);
  return;
}

Assistant:

void ThreadPool::Run(CallFunc func)
{
	if (!m_bRunning)
	{
		func();
	}
	else
	{
		LockGuard lock(m_mutex);
		while(m_tasks.size() >= m_maxTaskNum)
		{
			m_notFull.Wait();
		}
		
		m_tasks.push_back(func);
		m_notEmpty.Notify();
	}
}